

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O1

RealType __thiscall OpenMD::NVT::calcConservedQuantity(NVT *this)

{
  int iVar1;
  SimInfo *this_00;
  double dVar2;
  RealType RVar3;
  int iVar4;
  undefined1 auVar5 [16];
  pair<double,_double> pVar6;
  
  pVar6 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  this_00 = (this->super_VelocityVerletIntegrator).super_Integrator.info_;
  iVar1 = this_00->ndf_;
  iVar4 = SimInfo::getFdf(this_00);
  dVar2 = (double)(iVar1 - iVar4) * 8.31451e-07 * this->targetTemp_;
  RVar3 = Thermo::getTotalEnergy(&(this->super_VelocityVerletIntegrator).super_Integrator.thermo);
  auVar5._0_8_ = dVar2 * pVar6.second;
  auVar5._8_8_ = this->tauThermostat_ * dVar2 * this->tauThermostat_ * pVar6.first * pVar6.first;
  auVar5 = divpd(auVar5,_DAT_002a3700);
  return RVar3 + auVar5._8_8_ + auVar5._0_8_;
}

Assistant:

RealType NVT::calcConservedQuantity() {
    pair<RealType, RealType> thermostat = snap->getThermostat();
    RealType conservedQuantity;
    RealType fkBT;
    RealType Energy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;

    fkBT = info_->getNdf() * Constants::kB * targetTemp_;

    Energy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tauThermostat_ * tauThermostat_ *
                         thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    conservedQuantity = Energy + thermostat_kinetic + thermostat_potential;

    return conservedQuantity;
  }